

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fw_data_parser.c
# Opt level: O2

int image_fwdata_get_buffer(igsc_fwdata_image *img,uint8_t **buffer,uint32_t *buffer_len)

{
  uint32_t uVar1;
  int iVar2;
  
  if (buffer_len == (uint32_t *)0x0 ||
      (buffer == (uint8_t **)0x0 || img == (igsc_fwdata_image *)0x0)) {
    return 3;
  }
  iVar2 = 5;
  if ((img->buffer != (uint8_t *)0x0) && (uVar1 = img->buffer_len, uVar1 != 0)) {
    *buffer = img->buffer;
    *buffer_len = uVar1;
    iVar2 = 0;
  }
  return iVar2;
}

Assistant:

int image_fwdata_get_buffer(struct igsc_fwdata_image *img,
                            const uint8_t **buffer,
                            uint32_t *buffer_len)
{
    if (img == NULL || buffer == NULL || buffer_len == NULL )
    {
        return IGSC_ERROR_INVALID_PARAMETER;
    }

    if (img->buffer == NULL || img->buffer_len == 0)
    {
        return IGSC_ERROR_BAD_IMAGE;
    }

    *buffer = img->buffer;
    *buffer_len = img->buffer_len;

    return IGSC_SUCCESS;
}